

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

void __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindAllFileNames
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  _Base_ptr p_Var1;
  long lVar2;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(output,(this->by_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var1 = (this->by_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar2 = 0;
  while ((_Rb_tree_header *)p_Var1 != &(this->by_name_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&(((output->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void SimpleDescriptorDatabase::DescriptorIndex<Value>::FindAllFileNames(
    std::vector<std::string>* output) {
  output->resize(by_name_.size());
  int i = 0;
  for (const auto& kv : by_name_) {
    (*output)[i] = kv.first;
    i++;
  }
}